

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetNoInitSetup(void *kinmem,int noInitSetup)

{
  KINMem kin_mem;
  int noInitSetup_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetNoInitSetup","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *(int *)((long)kinmem + 0xb8) = noInitSetup;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetNoInitSetup(void *kinmem, booleantype noInitSetup)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetNoInitSetup", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_noInitSetup = noInitSetup;

  return(KIN_SUCCESS);
}